

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_affinity.h
# Opt level: O0

int __thiscall KMPNativeAffinity::Mask::get_system_affinity(Mask *this,bool abort_on_error)

{
  long lVar1;
  int *piVar2;
  undefined1 in_SIL;
  char *in_RDI;
  int error;
  int retval;
  undefined8 in_stack_ffffffffffffff50;
  int code;
  undefined1 local_38 [28];
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined3 in_stack_ffffffffffffffec;
  uint uVar3;
  int local_4;
  
  code = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  uVar3 = CONCAT13(in_SIL,in_stack_ffffffffffffffec) & 0x1ffffff;
  if (__kmp_affin_mask_size == 0) {
    __kmp_debug_assert(in_RDI,(char *)(CONCAT44(CONCAT13(in_SIL,in_stack_ffffffffffffffec),
                                                in_stack_ffffffffffffffe8) & 0x1ffffffffffffff),
                       in_stack_ffffffffffffffe4);
  }
  lVar1 = syscall(0xcc,0,__kmp_affin_mask_size,*(undefined8 *)(in_RDI + 8));
  if ((int)lVar1 < 0) {
    piVar2 = __errno_location();
    local_4 = *piVar2;
    if ((uVar3 & 0x1000000) != 0) {
      __kmp_msg_format((uint)local_38,0x40064);
      __kmp_msg_error_code(code);
      __kmp_fatal();
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int get_system_affinity(bool abort_on_error) override {
      KMP_ASSERT2(KMP_AFFINITY_CAPABLE(),
                  "Illegal get affinity operation when not capable");
      int retval =
          syscall(__NR_sched_getaffinity, 0, __kmp_affin_mask_size, mask);
      if (retval >= 0) {
        return 0;
      }
      int error = errno;
      if (abort_on_error) {
        __kmp_fatal(KMP_MSG(FatalSysError), KMP_ERR(error), __kmp_msg_null);
      }
      return error;
    }